

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void bitmanip::anon_unknown_0::runTest(Test *test)

{
  char *pcVar1;
  SourceLocation loc;
  SourceLocation loc_00;
  bool bVar2;
  int iVar3;
  long *in_FS_OFFSET;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  char *local_a8;
  char *local_a0;
  unsigned_long local_98;
  byte local_8d;
  byte local_8c;
  byte local_8b;
  byte local_8a;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char *local_28;
  char *local_20;
  unsigned_long local_18;
  Test *local_10;
  Test *test_local;
  
  local_10 = test;
  iVar3 = strcmp(*(char **)(*in_FS_OFFSET + -8),test->category);
  if (iVar3 != 0) {
    *(char **)(*in_FS_OFFSET + -8) = local_10->category;
    bVar2 = isLoggable(IMPORTANT);
    local_8a = 0;
    local_8b = 0;
    local_8c = 0;
    local_8d = 0;
    if (bVar2) {
      local_28 = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/main.cpp";
      local_20 = "runTest";
      local_18 = 0x14;
      pcVar1 = local_10->category;
      std::allocator<char>::allocator();
      local_8a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar1,&local_89);
      local_8b = 1;
      std::operator+(&local_68,"Category: \"",&local_88);
      local_8c = 1;
      std::operator+(&local_48,&local_68,"\" tests");
      local_8d = 1;
      loc.function = local_20;
      loc.file = local_28;
      loc.line = local_18;
      detail::
      vlog<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (IMPORTANT,loc,&local_48);
    }
    if ((local_8d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_48);
    }
    if ((local_8c & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_68);
    }
    if ((local_8b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_88);
    }
    if ((local_8a & 1) != 0) {
      std::allocator<char>::~allocator(&local_89);
    }
  }
  bVar2 = isLoggable(INFO);
  if (bVar2) {
    local_a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/main.cpp";
    local_a0 = "runTest";
    local_98 = 0x16;
    pcVar1 = local_10->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,pcVar1,&local_109);
    std::operator+(&local_e8,"Running \"",&local_108);
    std::operator+(&local_c8,&local_e8,"\" ...");
    loc_00.function = local_a0;
    loc_00.file = local_a8;
    loc_00.line = local_98;
    detail::vlog<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (INFO,loc_00,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
  }
  bVar2 = Test::operator()(local_10);
  (anonymous_namespace)::testFailureCount =
       (uint)((bVar2 ^ 0xffU) & 1) + (anonymous_namespace)::testFailureCount;
  return;
}

Assistant:

void runTest(const Test &test) noexcept
{
    static thread_local const char *previousCategory = "";

    if (std::strcmp(previousCategory, test.category) != 0) {
        previousCategory = test.category;
        BITMANIP_LOG(IMPORTANT, "Category: \"" + std::string{test.category} + "\" tests");
    }
    BITMANIP_LOG(INFO, "Running \"" + std::string{test.name} + "\" ...");
    testFailureCount += not test.operator()();
}